

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

OptionAdder * __thiscall
cxxopts::OptionAdder::operator()
          (OptionAdder *this,string *opts,string *desc,shared_ptr<const_cxxopts::Value> *value,
          string *arg_help)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char *pcVar3;
  Options *this_00;
  pointer pcVar4;
  size_t sVar5;
  long lVar6;
  invalid_option_format_error *piVar7;
  sub_match<const_char_*> *long_;
  sub_match<const_char_*> *short_;
  ulong uVar8;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  option_names;
  anon_class_1_0_00000001 local_f1;
  string *local_f0;
  shared_ptr<const_cxxopts::Value> local_e8;
  string local_d8;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_b8;
  string local_90;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_b8.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_begin = (char *)0x0;
  local_b8.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar2 = (opts->_M_dataplus)._M_p;
  local_f0 = opts;
  sVar5 = strlen(pcVar2);
  std::__detail::
  __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
            (pcVar2,pcVar2 + sVar5,&local_b8,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_specifier_abi_cxx11_,0);
  lVar6 = (long)local_b8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (lVar6 >> 3) * -0x5555555555555555;
  if (uVar8 < 4) {
    piVar7 = (invalid_option_format_error *)__cxa_allocate_exception(0x28);
    invalid_option_format_error::invalid_option_format_error(piVar7,local_f0);
    __cxa_throw(piVar7,&invalid_option_format_error::typeinfo,OptionException::~OptionException);
  }
  if ((local_b8.
       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       .
       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_b8.
       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       .
       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (0xfffffffffffffffc < uVar8 - 6)) {
    short_ = (sub_match<const_char_*> *)
             ((long)local_b8.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x48);
LAB_0011a3f8:
    long_ = (sub_match<const_char_*> *)
            ((long)local_b8.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x48);
  }
  else {
    short_ = local_b8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
    if (0xfffffffffffffffb < uVar8 - 7) goto LAB_0011a3f8;
    long_ = local_b8.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 3;
  }
  pcVar2 = (long_->super_pair<const_char_*,_const_char_*>).first;
  pcVar3 = (long_->super_pair<const_char_*,_const_char_*>).second;
  if ((short_->matched == true) &&
     ((short_->super_pair<const_char_*,_const_char_*>).second !=
      (short_->super_pair<const_char_*,_const_char_*>).first)) {
    if ((long_->matched & (long)pcVar3 - (long)pcVar2 == 1) != 1) {
LAB_0011a45a:
      operator()::anon_class_1_0_00000001::operator()(&local_70,&local_f1,short_,long_);
      this_00 = this->m_options;
      pcVar4 = (desc->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,pcVar4 + desc->_M_string_length);
      local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (value->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (value->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
      if (local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_d8._M_dataplus._M_p = (arg_help->_M_dataplus)._M_p;
      paVar1 = &arg_help->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == paVar1) {
        local_d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_d8.field_2._8_8_ = *(undefined8 *)((long)&arg_help->field_2 + 8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_d8._M_string_length = arg_help->_M_string_length;
      (arg_help->_M_dataplus)._M_p = (pointer)paVar1;
      arg_help->_M_string_length = 0;
      (arg_help->field_2)._M_local_buf[0] = '\0';
      Options::add_option(this_00,&this->m_group,
                          &local_70.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           ._M_head_impl,(string *)&local_70,&local_90,&local_e8,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p !=
          &local_70.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl.field_2) {
        operator_delete(local_70.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl._M_dataplus._M_p,
                        local_70.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p !=
          &local_70.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl.field_2) {
        operator_delete(local_70.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl._M_dataplus._M_p,
                        local_70.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl.field_2._M_allocated_capacity + 1);
      }
      if (local_b8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return this;
    }
    piVar7 = (invalid_option_format_error *)__cxa_allocate_exception(0x28);
    invalid_option_format_error::invalid_option_format_error(piVar7,local_f0);
  }
  else {
    if ((long_->matched != false) && (pcVar3 != pcVar2)) goto LAB_0011a45a;
    piVar7 = (invalid_option_format_error *)__cxa_allocate_exception(0x28);
    invalid_option_format_error::invalid_option_format_error(piVar7,local_f0);
  }
  __cxa_throw(piVar7,&invalid_option_format_error::typeinfo,OptionException::~OptionException);
}

Assistant:

OptionAdder&
OptionAdder::operator()
(
  const std::string& opts,
  const std::string& desc,
  std::shared_ptr<const Value> value,
  std::string arg_help
)
{
  std::match_results<const char*> result;
  std::regex_match(opts.c_str(), result, option_specifier);

  if (result.empty())
  {
    throw invalid_option_format_error(opts);
  }

  const auto& short_match = result[2];
  const auto& long_match = result[3];

  if (!short_match.length() && !long_match.length())
  {
    throw invalid_option_format_error(opts);
  } else if (long_match.length() == 1 && short_match.length())
  {
    throw invalid_option_format_error(opts);
  }

  auto option_names = []
  (
    const std::sub_match<const char*>& short_,
    const std::sub_match<const char*>& long_
  )
  {
    if (long_.length() == 1)
    {
      return std::make_tuple(long_.str(), short_.str());
    }
    else
    {
      return std::make_tuple(short_.str(), long_.str());
    }
  }(short_match, long_match);

  m_options.add_option
  (
    m_group,
    std::get<0>(option_names),
    std::get<1>(option_names),
    desc,
    value,
    std::move(arg_help)
  );

  return *this;
}